

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O1

bool bc7decomp::unpack_bc7_mode0_2(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  ulong uVar1;
  sbyte sVar2;
  uint32_t bits;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint32_t c_1;
  uint uVar9;
  int iVar10;
  long lVar11;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar12;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar13;
  uint uVar14;
  uint32_t total_bits_3;
  uint uVar15;
  uint32_t total_bits;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint32_t total_bits_1;
  undefined1 *puVar20;
  uint32_t c_2;
  long lVar21;
  uint32_t c;
  long lVar22;
  uint32_t i;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  uint32_t weights [16];
  undefined1 local_118 [32];
  uint auStack_f8 [8];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_d8 [24];
  uint auStack_78 [6];
  color_rgba endpoints [6];
  uint32_t pbits [6];
  
  bVar26 = mode == 0;
  uVar15 = 0;
  uVar23 = 0;
  uVar9 = mode + 1;
  if (uVar9 != 0) {
    uVar23 = 0;
    uVar3 = 0;
    uVar15 = 0;
    do {
      iVar16 = 8 - (uVar15 & 7);
      if ((int)(uVar9 - uVar3) <= iVar16) {
        iVar16 = uVar9 - uVar3;
      }
      uVar23 = uVar23 | (~(-1 << ((byte)iVar16 & 0x1f)) &
                        (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar15 >> 3)) >>
                              (sbyte)(uVar15 & 7))) << ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 + iVar16;
      uVar15 = uVar15 + iVar16;
    } while (uVar3 < uVar9);
  }
  uVar9 = 1 << ((byte)mode & 0x1f);
  if (uVar23 == uVar9) {
    uVar3 = bVar26 + 2;
    uVar14 = bVar26 ^ 5;
    uVar8 = (uint)(mode != 0) * 2 + 4;
    uVar6 = 0;
    uVar17 = 0;
    do {
      iVar10 = uVar8 - uVar17;
      iVar16 = 8 - (uVar15 & 7);
      if (iVar10 <= iVar16) {
        iVar16 = iVar10;
      }
      uVar4 = (uint)uVar6 |
              (~(-1 << ((byte)iVar16 & 0x1f)) &
              (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar15 >> 3)) >> (sbyte)(uVar15 & 7))) <<
              ((byte)uVar17 & 0x1f);
      uVar6 = (ulong)uVar4;
      uVar17 = uVar17 + iVar16;
      uVar15 = iVar16 + uVar15;
    } while (uVar17 < uVar8);
    lVar22 = 0;
    do {
      lVar11 = 0;
      do {
        uVar8 = 0;
        uVar17 = 0;
        do {
          uVar19 = uVar15;
          uVar18 = uVar19 & 7;
          iVar10 = uVar14 - uVar17;
          iVar16 = 8 - uVar18;
          if (iVar10 <= (int)(8 - uVar18)) {
            iVar16 = iVar10;
          }
          uVar8 = uVar8 | (~(-1 << ((byte)iVar16 & 0x1f)) &
                          (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar19 >> 3)) >>
                                (sbyte)uVar18)) << ((byte)uVar17 & 0x1f);
          uVar17 = uVar17 + iVar16;
          uVar15 = iVar16 + uVar19;
        } while (uVar17 < uVar14);
        *(char *)((long)auStack_f8 + lVar11 * 4 + lVar22 + -0x20) = (char)uVar8;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 6);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    if (mode == 0) {
      iVar16 = 8 - uVar18;
      if (iVar10 < (int)(8 - uVar18)) {
        iVar16 = iVar10;
      }
      uVar24 = 0;
      do {
        uVar15 = iVar16 + uVar19 + (int)uVar24;
        uVar1 = uVar24 + 1;
        auStack_f8[uVar24] =
             (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar15 >> 3)) >> (uVar15 & 7) & 1) != 0);
        bVar25 = uVar24 < 5;
        uVar24 = uVar1;
      } while (bVar25);
      iVar16 = 8 - uVar18;
      if (iVar10 < (int)(8 - uVar18)) {
        iVar16 = iVar10;
      }
      uVar15 = uVar19 + (int)uVar1 + iVar16;
    }
    uVar24 = 0;
    do {
      if (((uVar24 == 0) || (uVar24 == (byte)g_bc7_table_anchor_index_third_subset_1[uVar6])) ||
         (uVar8 = uVar3, uVar24 == (byte)g_bc7_table_anchor_index_third_subset_2[uVar6])) {
        uVar8 = bVar26 + 1;
      }
      uVar17 = 0;
      uVar19 = 0;
      do {
        iVar16 = 8 - (uVar15 & 7);
        if ((int)(uVar8 - uVar19) <= iVar16) {
          iVar16 = uVar8 - uVar19;
        }
        uVar17 = uVar17 | (~(-1 << ((byte)iVar16 & 0x1f)) &
                          (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar15 >> 3)) >>
                                (sbyte)(uVar15 & 7))) << ((byte)uVar19 & 0x1f);
        uVar19 = uVar19 + iVar16;
        uVar15 = iVar16 + uVar15;
      } while (uVar19 < uVar8);
      auStack_78[uVar24] = uVar17;
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0x10);
    puVar20 = local_118;
    lVar22 = 0;
    do {
      lVar11 = 0;
      do {
        bVar7 = 0xff;
        if (lVar11 != 3) {
          if (mode == 0) {
            uVar8 = ((uint)(byte)puVar20[lVar11] * 2 | auStack_f8[lVar22]) << (bVar26 ^ 2U);
            uVar15 = uVar14 + 1;
          }
          else {
            uVar8 = (uint)(byte)puVar20[lVar11] << (8U - (char)uVar14 & 0x1f);
            uVar15 = uVar14;
          }
          bVar7 = (byte)(uVar8 >> (sbyte)uVar15) | (byte)uVar8;
        }
        puVar20[lVar11] = bVar7;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar22 = lVar22 + 1;
      puVar20 = puVar20 + 4;
    } while (lVar22 != 6);
    paVar13 = local_d8;
    puVar20 = local_118 + 4;
    lVar22 = 0;
    do {
      lVar11 = 0;
      paVar12 = paVar13;
      do {
        puVar5 = &g_bc7_weights2;
        if (mode == 0) {
          puVar5 = &g_bc7_weights3;
        }
        iVar16 = puVar5[lVar11];
        lVar21 = 0;
        do {
          paVar12->m_comps[lVar21] =
               (uint8_t)((uint)(byte)puVar20[lVar21 + -4] * (0x40 - iVar16) +
                         (uint)(byte)puVar20[lVar21] * iVar16 + 0x20 >> 6);
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        local_d8[0].m_comps[lVar11 * 4 + lVar22 * 0x20 + 3] = 0xff;
        lVar11 = lVar11 + 1;
        sVar2 = (sbyte)uVar3;
        paVar12 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar12->m_comps + 4);
      } while ((uint)lVar11 >> sVar2 == 0);
      lVar22 = lVar22 + 1;
      puVar20 = puVar20 + 8;
      paVar13 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar13->m_comps + 0x20);
    } while (lVar22 != 3);
    uVar6 = (ulong)(0 >> sVar2);
    do {
      pPixels[uVar6].field_0 =
           local_d8[(ulong)(byte)g_bc7_partition3[(uVar4 << 4) + uVar6] * 8 +
                    (ulong)auStack_78[uVar6]];
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x10);
  }
  return uVar23 == uVar9;
}

Assistant:

bool unpack_bc7_mode0_2(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	//const uint32_t SUBSETS = 3;
	const uint32_t ENDPOINTS = 6;
	const uint32_t COMPS = 3;
	const uint32_t WEIGHT_BITS = (mode == 0) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 0) ? 4 : 5;
	const uint32_t PBITS = (mode == 0) ? 6 : 0;
	const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t part = read_bits32(pBuf, bit_offset, (mode == 0) ? 4 : 6);

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);

	uint32_t pbits[6];
	for (uint32_t p = 0; p < PBITS; p++)
		pbits[p] = read_bits32(pBuf, bit_offset, 1);

	uint32_t weights[16];
	for (uint32_t i = 0; i < 16; i++)
		weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == g_bc7_table_anchor_index_third_subset_1[part]) || (i == g_bc7_table_anchor_index_third_subset_2[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);

	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)((c == 3) ? 255 : (PBITS ? bc7_dequant(endpoints[e][c], pbits[e], ENDPOINT_BITS) : bc7_dequant(endpoints[e][c], ENDPOINT_BITS)));

	color_rgba block_colors[3][8];
	for (uint32_t s = 0; s < 3; s++)
		for (uint32_t i = 0; i < WEIGHT_VALS; i++)
		{
			for (uint32_t c = 0; c < 3; c++)
				block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
			block_colors[s][i][3] = 255;
		}

	for (uint32_t i = 0; i < 16; i++)
		pPixels[i] = block_colors[g_bc7_partition3[part * 16 + i]][weights[i]];

	return true;
}